

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SzReadNumber32(CSzData *sd,UInt32 *value)

{
  Byte BVar1;
  size_t sVar2;
  Byte *pBVar3;
  SRes SVar4;
  UInt64 value64;
  ulong local_10;
  
  sVar2 = sd->Size;
  if (sVar2 == 0) {
    return 0x10;
  }
  pBVar3 = sd->Data;
  BVar1 = *pBVar3;
  if ((char)BVar1 < '\0') {
    SVar4 = ReadNumber(sd,&local_10);
    if (SVar4 != 0) {
      return SVar4;
    }
    if (0x7ffffffe < local_10) {
      return 4;
    }
    *value = (UInt32)local_10;
  }
  else {
    *value = (int)(char)BVar1;
    sd->Data = pBVar3 + 1;
    sd->Size = sVar2 - 1;
  }
  return 0;
}

Assistant:

static MY_NO_INLINE SRes SzReadNumber32(CSzData *sd, UInt32 *value)
{
  Byte firstByte;
  UInt64 value64;
  if (sd->Size == 0)
    return SZ_ERROR_ARCHIVE;
  firstByte = *sd->Data;
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    sd->Data++;
    sd->Size--;
    return SZ_OK;
  }
  RINOK(ReadNumber(sd, &value64));
  if (value64 >= (UInt32)0x80000000 - 1)
    return SZ_ERROR_UNSUPPORTED;
  if (value64 >= ((UInt64)(1) << ((sizeof(size_t) - 1) * 8 + 4)))
    return SZ_ERROR_UNSUPPORTED;
  *value = (UInt32)value64;
  return SZ_OK;
}